

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goodbye_inter.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Slot_Flags flags;
  Am_Object *pAVar5;
  Am_Object local_58 [8];
  Am_Object local_50 [8];
  Am_Object local_48 [8];
  Am_Object local_40 [8];
  Am_Object local_38 [24];
  Am_Object local_20 [8];
  Am_Object local_18 [12];
  undefined4 local_c;
  
  local_c = 0;
  Am_Initialize();
  Am_Object::Create((char *)local_20);
  uVar1 = Am_Object::Set((ushort)local_20,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,0x66,200);
  uVar2 = Am_Object::Set(uVar1,0x67,0x32);
  Am_Object::Create((char *)local_40);
  uVar3 = Am_Object::Set((ushort)local_40,(char *)0xab,0x103012);
  Am_Object::Create((char *)local_58);
  Am_Object::Get_Object((ushort)local_50,(ulong)local_58);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&quit_method);
  flags = Am_Object::Set((ushort)local_50,(Am_Method_Wrapper *)0xca,(ulong)pAVar4);
  Am_Object::Get_Owner(local_48,flags);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(uVar3,local_48,1,0);
  Am_Object::Am_Object(local_38,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(uVar2,local_38,1,0);
  Am_Object::Am_Object(local_18,pAVar5);
  Am_Object::Add_Part(&Am_Screen,local_18,1,0);
  Am_Object::~Am_Object(local_18);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(local_48);
  Am_Object::~Am_Object(local_50);
  Am_Object::~Am_Object(local_58);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(local_20);
  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}

Assistant:

int main (void)
{
  Am_Initialize ();

  Am_Screen
    .Add_Part( Am_Window.Create ("window")
      .Set( Am_LEFT, 50 )
      .Set( Am_TOP, 50 )
      .Set( Am_WIDTH, 200 )
      .Set( Am_HEIGHT, 50 )
      .Add_Part( Am_Text.Create ("string")
        .Set( Am_TEXT, "Goodbye World!")
        .Add_Part( Am_One_Shot_Interactor.Create()
          .Get_Object( Am_COMMAND )
          .Set( Am_DO_METHOD, quit_method )
          .Get_Owner()
        )
      )
    );

  Am_Main_Event_Loop ();
  Am_Cleanup ();

  return 0;
}